

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_Prewitt(PrewittForm2 Prewitt)

{
  uint32_t uVar1;
  reference pvVar2;
  code *in_RDI;
  Image *unaff_retaddr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000008;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff5c;
  uint8_t value;
  undefined6 in_stack_ffffffffffffff60;
  uint8_t in_stack_ffffffffffffff66;
  uint8_t in_stack_ffffffffffffff67;
  undefined8 in_stack_ffffffffffffff68;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  reference in_stack_ffffffffffffff70;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_40 [2];
  code *local_10;
  bool local_1;
  
  local_10 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff5c);
  value = (uint8_t)(in_stack_ffffffffffffff5c >> 0x18);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff70,(uint32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff68,in_stack_ffffffffffffff67,in_stack_ffffffffffffff66
            );
  Test_Helper::uniformImages(in_stack_00000008,unaff_retaddr);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e676d);
  pvVar2 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](local_40,0);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar2);
  if (2 < uVar1) {
    pvVar2 = std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::operator[](local_40,0);
    uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar2);
    if (2 < uVar1) {
      this = local_40;
      in_stack_ffffffffffffff70 =
           std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,0);
      pvVar2 = std::
               vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
               ::operator[](this,1);
      (*local_10)(in_stack_ffffffffffffff70,pvVar2);
      std::
      vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
      ::operator[](local_40,1);
      local_1 = Unit_Test::verifyImage
                          ((Image *)CONCAT17(in_stack_ffffffffffffff67,
                                             CONCAT16(in_stack_ffffffffffffff66,
                                                      in_stack_ffffffffffffff60)),value);
      goto LAB_001e6892;
    }
  }
  local_1 = true;
LAB_001e6892:
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)in_stack_ffffffffffffff70);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff70);
  return (bool)(local_1 & 1);
}

Assistant:

bool form2_Prewitt(PrewittForm2 Prewitt)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > image = uniformImages( intensity );
        if ( (image[0].width() < 3) || (image[0].height() < 3) )
            return true;

        Prewitt( image[0], image[1] );

        return verifyImage( image[1], 0u );
    }